

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

uchar mbedtls_ct_base64_enc_char(uchar value)

{
  uint uVar1;
  
  uVar1 = (uint)value;
  return ~((byte)(uVar1 + 0xffc1 >> 8) | (byte)(0x3f - uVar1 >> 8)) & 0x2f |
         ~((byte)(uVar1 + 0xffc2 >> 8) | (byte)(0x3e - uVar1 >> 8)) & 0x2b |
         ~((byte)(uVar1 + 0xffcc >> 8) | (byte)(0x3d - uVar1 >> 8)) & value - 4 |
         ~((byte)(uVar1 + 0xffe6 >> 8) | (byte)(0x33 - uVar1 >> 8)) & value + 0x47 |
         ~(byte)(0x19 - uVar1 >> 8) & value + 0x41;
}

Assistant:

MBEDTLS_STATIC_TESTABLE
unsigned char mbedtls_ct_base64_enc_char(unsigned char value)
{
    unsigned char digit = 0;
    /* For each range of values, if value is in that range, mask digit with
     * the corresponding value. Since value can only be in a single range,
     * only at most one masking will change digit. */
    digit |= mbedtls_ct_uchar_in_range_if(0, 25, value, 'A' + value);
    digit |= mbedtls_ct_uchar_in_range_if(26, 51, value, 'a' + value - 26);
    digit |= mbedtls_ct_uchar_in_range_if(52, 61, value, '0' + value - 52);
    digit |= mbedtls_ct_uchar_in_range_if(62, 62, value, '+');
    digit |= mbedtls_ct_uchar_in_range_if(63, 63, value, '/');
    return digit;
}